

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

void __thiscall
mjs::regexp_object::regexp_object
          (regexp_object *this,gc_heap_ptr<mjs::global_object> *global,object_ptr *prototype,
          string *source,regexp_flag flags)

{
  property_attribute pVar1;
  global_object *pgVar2;
  gc_heap_ptr<mjs::gc_string> *p;
  string local_40;
  regexp_flag local_2c;
  string *psStack_28;
  regexp_flag flags_local;
  string *source_local;
  object_ptr *prototype_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  regexp_object *this_local;
  
  local_2c = flags;
  psStack_28 = source;
  source_local = (string *)prototype;
  prototype_local = (object_ptr *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_40,pgVar2,"RegExp");
  native_object::native_object(&this->super_native_object,&local_40,(object_ptr *)source_local);
  string::~string(&local_40);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_0029bee0;
  gc_heap_ptr_untracked<mjs::global_object,_true>::gc_heap_ptr_untracked
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
             &(this->super_native_object).field_0x24,
             (gc_heap_ptr<mjs::global_object> *)prototype_local);
  p = string::unsafe_raw_get(psStack_28);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked(&this->source_,p);
  value_representation::value_representation(&this->last_index_,0.0);
  this->flags_ = local_2c;
  pVar1 = operator|(dont_enum,dont_delete);
  pVar1 = operator|(pVar1,read_only);
  native_object::add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_source,_nullptr>
            (&this->super_native_object,"source",pVar1);
  pVar1 = operator|(dont_enum,dont_delete);
  pVar1 = operator|(pVar1,read_only);
  native_object::add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_global,_nullptr>
            (&this->super_native_object,"global",pVar1);
  pVar1 = operator|(dont_enum,dont_delete);
  pVar1 = operator|(pVar1,read_only);
  native_object::
  add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_ignoreCase,_nullptr>
            (&this->super_native_object,"ignoreCase",pVar1);
  pVar1 = operator|(dont_enum,dont_delete);
  pVar1 = operator|(pVar1,read_only);
  native_object::
  add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_multiline,_nullptr>
            (&this->super_native_object,"multiline",pVar1);
  pVar1 = operator|(dont_enum,dont_delete);
  native_object::
  add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_lastIndex,_&mjs::regexp_object::put_lastIndex>
            (&this->super_native_object,"lastIndex",pVar1);
  return;
}

Assistant:

explicit regexp_object(const gc_heap_ptr<global_object>& global, const object_ptr& prototype, const string& source, regexp_flag flags)
        : native_object(global->common_string("RegExp"), prototype)
        , global_(global)
        , source_(source.unsafe_raw_get())
        , last_index_(value_representation{0.0})
        , flags_(flags) {
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, source);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, global);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, ignoreCase);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, multiline);
        DEFINE_NATIVE_PROPERTY(regexp_object, lastIndex);
    }